

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O0

int mapVoronoi(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000034;
  int *src;
  int *in_stack_00000040;
  int err;
  int ph;
  int pw;
  int pz;
  int px;
  int in_stack_00000078;
  int in_stack_00000080;
  int in_stack_00000088;
  int local_1c;
  
  iVar1 = in_EDX + -2 >> 2;
  iVar2 = in_ECX + -2 >> 2;
  iVar3 = ((in_EDX + -2 + in_R8D >> 2) - iVar1) + 2;
  iVar4 = ((in_ECX + -2 + in_R9D >> 2) - iVar2) + 2;
  if ((*(long *)(in_RDI + 0x38) == 0) ||
     (local_1c = (*(code *)**(undefined8 **)(in_RDI + 0x38))
                           (*(undefined8 *)(in_RDI + 0x38),in_RSI,iVar1,iVar2,iVar3,iVar4),
     local_1c == 0)) {
    memmove((void *)((long)in_RSI + (long)in_R8D * (long)in_R9D * 4),in_RSI,
            (long)iVar3 * 4 * (long)iVar4);
    mapVoronoiPlane(_pz,_ph,in_stack_00000040,src._4_4_,(int)src,in_stack_00000034,z,(int)out,(int)l
                    ,in_stack_00000078,in_stack_00000080,in_stack_00000088);
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

int mapVoronoi(const Layer * l, int * out, int x, int z, int w, int h)
{
    x -= 2;
    z -= 2;
    int px = x >> 2;
    int pz = z >> 2;
    int pw = ((x + w) >> 2) - px + 2;
    int ph = ((z + h) >> 2) - pz + 2;

    if (l->p)
    {
        int err = l->p->getMap(l->p, out, px, pz, pw, ph);
        if (err != 0)
            return err;
    }

    int *src = out + (int64_t)w*h;
    memmove(src, out, sizeof(int)*pw*ph);
    mapVoronoiPlane(l->startSalt, out, src, x,z,w,h, 0, px,pz,pw,ph);

    return 0;
}